

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O2

void duckdb::ParquetDecodeUtils::VarintEncode<unsigned_long>(unsigned_long val,WriteStream *ser)

{
  bool bVar1;
  byte local_29;
  
  do {
    local_29 = (0x7f < val) << 7 | (byte)val & 0x7f;
    (**ser->_vptr_WriteStream)(ser,&local_29,1);
    bVar1 = 0x7f < val;
    val = val >> 7;
  } while (bVar1);
  return;
}

Assistant:

static void VarintEncode(T val, WriteStream &ser) {
		do {
			uint8_t byte = val & 127;
			val >>= 7;
			if (val != 0) {
				byte |= 128;
			}
			ser.Write<uint8_t>(byte);
		} while (val != 0);
	}